

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

QList<QtGraphicsAnchorLayout::AnchorVertex_*> * __thiscall
QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>::uniqueKeys
          (QList<QtGraphicsAnchorLayout::AnchorVertex_*> *__return_storage_ptr__,
          QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>
          *this)

{
  ulong uVar1;
  ulong uVar2;
  Data *pDVar3;
  long in_FS_OFFSET;
  AnchorVertex *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (AnchorVertex **)0x0;
  (__return_storage_ptr__->d).size = 0;
  pDVar3 = this->d;
  if (pDVar3 != (Data *)0x0) {
    if (pDVar3->spans->offsets[0] == 0xff) {
      uVar1 = 1;
      do {
        uVar2 = uVar1;
        if (pDVar3->numBuckets == uVar2) {
          pDVar3 = (Data *)0x0;
          uVar2 = 0;
          break;
        }
        uVar1 = uVar2 + 1;
      } while (pDVar3->spans[uVar2 >> 7].offsets[(uint)uVar2 & 0x7f] == 0xff);
      if (pDVar3 == (Data *)0x0 && uVar2 == 0) goto LAB_005c46f1;
    }
    else {
      uVar2 = 0;
    }
    do {
      local_30 = *(AnchorVertex **)
                  pDVar3->spans[uVar2 >> 7].entries
                  [pDVar3->spans[uVar2 >> 7].offsets[(uint)uVar2 & 0x7f]].storage.data;
      QtPrivate::QPodArrayOps<QtGraphicsAnchorLayout::AnchorVertex*>::
      emplace<QtGraphicsAnchorLayout::AnchorVertex*&>
                ((QPodArrayOps<QtGraphicsAnchorLayout::AnchorVertex*> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,&local_30);
      QList<QtGraphicsAnchorLayout::AnchorVertex_*>::end(__return_storage_ptr__);
      do {
        if (pDVar3->numBuckets - 1 == uVar2) {
          pDVar3 = (Data *)0x0;
          uVar2 = 0;
          break;
        }
        uVar2 = uVar2 + 1;
      } while (pDVar3->spans[uVar2 >> 7].offsets[(uint)uVar2 & 0x7f] == 0xff);
    } while ((pDVar3 != (Data *)0x0) || (uVar2 != 0));
  }
LAB_005c46f1:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<Key> uniqueKeys() const
    {
        QList<Key> res;
        if (d) {
            auto i = d->begin();
            while (i != d->end()) {
                res.append(i.node()->key);
                ++i;
            }
        }
        return res;
    }